

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O0

void __thiscall ipx::Model::Model(Model *this)

{
  undefined1 *in_RDI;
  SparseMatrix *this_00;
  SparseMatrix *in_stack_ffffffffffffffa0;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  SparseMatrix::SparseMatrix(in_stack_ffffffffffffffa0);
  SparseMatrix::SparseMatrix(in_stack_ffffffffffffffa0);
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x118));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x128));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x138));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x148));
  *(undefined8 *)(in_RDI + 0x158) = 0;
  *(undefined8 *)(in_RDI + 0x160) = 0;
  *(undefined4 *)(in_RDI + 0x168) = 0;
  *(undefined4 *)(in_RDI + 0x16c) = 0;
  *(undefined4 *)(in_RDI + 0x170) = 0;
  *(undefined4 *)(in_RDI + 0x174) = 0;
  *(undefined4 *)(in_RDI + 0x178) = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4819df);
  this_00 = (SparseMatrix *)(in_RDI + 0x198);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x4819f5);
  *(undefined8 *)(in_RDI + 0x1b0) = 0;
  *(undefined8 *)(in_RDI + 0x1b8) = 0;
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x1c8));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x1d8));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x1e8));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x1f8));
  SparseMatrix::SparseMatrix(this_00);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x481a98);
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x2a0));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x2b0));
  return;
}

Assistant:

Model() = default;